

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<128U,_33U,_buffer_layout_dfs>::operator()
          (fill<128U,_33U,_buffer_layout_dfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long uVar1;
  uchar *__s1;
  unsigned_long uVar2;
  uchar *__s2;
  array<unsigned_long,_128UL> *buffer_count_00;
  int iVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  uchar **from0;
  unsigned_long *puVar7;
  fill<128U,_66U,_buffer_layout_dfs> local_74;
  fill<128U,_67U,_buffer_layout_dfs> local_73;
  fill<128U,_67U,_buffer_layout_dfs> local_72;
  fill<128U,_66U,_buffer_layout_dfs> local_71;
  uchar **local_70;
  array<Stream,_128UL> *local_68;
  uchar **local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  array<unsigned_long,_128UL> *local_48;
  size_t local_40;
  long local_38;
  
  puVar7 = buffer_count->_M_elems + 0x42;
  local_58 = buffer_count->_M_elems + 0x43;
  local_60 = buffer + 0x64f;
  local_70 = buffer + 0x647;
  sVar5 = 0;
  lVar6 = 0;
  local_68 = streams;
  local_50 = puVar7;
  local_48 = buffer_count;
  while ((buffer_count_00 = local_48, *puVar7 != 0 ||
         (fill<128U,_66U,_buffer_layout_dfs>::operator()(&local_71,local_68,buffer,local_48),
         buffer_count_00->_M_elems[0x42] != 0))) {
    if ((*local_58 == 0) &&
       (fill<128U,_67U,_buffer_layout_dfs>::operator()(&local_72,local_68,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x43] == 0)) {
      __n = -lVar6;
      lVar6 = -sVar5;
      goto LAB_00175f13;
    }
    puVar4 = local_58;
    uVar1 = *puVar7;
    __s1 = buffer[0x666 - uVar1];
    local_40 = sVar5;
    local_38 = lVar6;
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    uVar2 = *local_58;
    __s2 = buffer[0x67d - uVar2];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    sVar5 = local_40;
    puVar7 = local_50;
    if (iVar3 < 1) {
      puVar4 = local_50;
      __s2 = __s1;
      uVar2 = uVar1;
    }
    buffer[local_40 + 0x647] = __s2;
    *puVar4 = uVar2 - 1;
    check_input(local_70,local_40);
    lVar6 = local_38 + -8;
    sVar5 = sVar5 + 1;
    if (sVar5 == 8) {
      local_48->_M_elems[0x21] = 8;
      return;
    }
  }
  __n = -lVar6;
  lVar6 = -sVar5;
  do {
    if ((buffer_count_00->_M_elems[0x43] == 0) &&
       (fill<128U,_67U,_buffer_layout_dfs>::operator()(&local_73,local_68,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x43] == 0)) goto LAB_00175f7b;
    uVar1 = buffer_count_00->_M_elems[0x43];
    *(uchar **)((long)buffer + __n + 0x3238) = buffer[0x67d - uVar1];
    buffer_count_00->_M_elems[0x43] = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
  goto LAB_00175f64;
LAB_00175f7b:
  from0 = (uchar **)((long)local_60 - __n);
  sVar5 = -lVar6;
  memmove(local_60 + lVar6,local_70,__n);
  buffer_count_00->_M_elems[0x21] = sVar5;
  goto LAB_00175fa4;
  while( true ) {
    uVar1 = *puVar7;
    *(uchar **)((long)buffer + __n + 0x3238) = buffer[0x666 - uVar1];
    *puVar7 = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
    if (__n == 0x40) break;
LAB_00175f13:
    if ((*puVar7 == 0) &&
       (fill<128U,_66U,_buffer_layout_dfs>::operator()(&local_74,local_68,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0x42] == 0)) goto LAB_00175f7b;
  }
LAB_00175f64:
  buffer_count_00->_M_elems[0x21] = 8;
  sVar5 = 8;
  from0 = local_70;
LAB_00175fa4:
  check_input(from0,sVar5);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}